

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

CBString * compressionTypeToUString(CBString *__return_storage_ptr__,UINT8 algorithm)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch((int)CONCAT71(in_register_00000031,algorithm)) {
  case 1:
    s = "None";
    break;
  case 2:
    s = "EFI 1.1";
    break;
  case 3:
    s = "Tiano";
    break;
  case 4:
    s = "Undecided Tiano/EFI 1.1";
    break;
  case 5:
    s = "LZMA";
    break;
  case 6:
    s = "Intel legacy LZMA";
    break;
  case 7:
    s = "LZMAF86";
    break;
  case 8:
    s = "GZip";
    break;
  case 9:
    s = "Zlib";
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",algorithm);
    return __return_storage_ptr__;
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString compressionTypeToUString(const UINT8 algorithm)
{
    switch (algorithm) {
        case COMPRESSION_ALGORITHM_NONE:                    return UString("None");
        case COMPRESSION_ALGORITHM_EFI11:                   return UString("EFI 1.1");
        case COMPRESSION_ALGORITHM_TIANO:                   return UString("Tiano");
        case COMPRESSION_ALGORITHM_UNDECIDED:               return UString("Undecided Tiano/EFI 1.1");
        case COMPRESSION_ALGORITHM_LZMA:                    return UString("LZMA");
        case COMPRESSION_ALGORITHM_LZMA_INTEL_LEGACY:       return UString("Intel legacy LZMA");
        case COMPRESSION_ALGORITHM_LZMAF86:                 return UString("LZMAF86");
        case COMPRESSION_ALGORITHM_GZIP:                    return UString("GZip");
        case COMPRESSION_ALGORITHM_ZLIB:                    return UString("Zlib");
    }
    
    return usprintf("Unknown %02Xh", algorithm);
}